

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextBuffer::appendv(ImGuiTextBuffer *this,char *fmt,__va_list_tag *args)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *__dest;
  ImGuiContext *pIVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  va_list args_copy;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  local_38 = args->reg_save_area;
  local_48._0_4_ = args->gp_offset;
  local_48._4_4_ = args->fp_offset;
  pvStack_40 = args->overflow_arg_area;
  uVar4 = vsnprintf((char *)0x0,0,fmt,args);
  pIVar5 = GImGui;
  if ((int)uVar4 < 1) {
    return;
  }
  iVar2 = (this->Buf).Size;
  iVar7 = uVar4 + iVar2;
  iVar3 = (this->Buf).Capacity;
  if (iVar7 < iVar3) {
LAB_00120793:
    if (iVar7 <= iVar3) {
      __dest = (this->Buf).Data;
      goto LAB_00120814;
    }
    if (iVar3 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar3 / 2 + iVar3;
    }
    if (iVar6 <= iVar7) {
      iVar6 = iVar7;
    }
  }
  else {
    iVar6 = iVar3 * 2;
    if (iVar7 != iVar6 && SBORROW4(iVar7,iVar6) == iVar7 + iVar3 * -2 < 0) {
      iVar6 = iVar7;
    }
    if (iVar6 <= iVar3) goto LAB_00120793;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (char *)(*(pIVar5->IO).MemAllocFn)((long)iVar6);
  pcVar8 = (this->Buf).Data;
  if (pcVar8 == (char *)0x0) {
LAB_00120804:
    pcVar8 = (char *)0x0;
    pIVar5 = GImGui;
  }
  else {
    memcpy(__dest,pcVar8,(long)(this->Buf).Size);
    pIVar5 = GImGui;
    pcVar8 = (this->Buf).Data;
    if (pcVar8 == (char *)0x0) goto LAB_00120804;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar5->IO).MemFreeFn)(pcVar8);
  (this->Buf).Data = __dest;
  (this->Buf).Capacity = iVar6;
LAB_00120814:
  (this->Buf).Size = iVar7;
  vsnprintf(__dest + (long)iVar2 + -1,(ulong)uVar4 + 1,fmt,&local_48);
  __dest[((ulong)uVar4 - 1) + (long)iVar2] = '\0';
  return;
}

Assistant:

void ImGuiTextBuffer::appendv(const char* fmt, va_list args)
{
    va_list args_copy;
    va_copy(args_copy, args);

    int len = vsnprintf(NULL, 0, fmt, args);         // FIXME-OPT: could do a first pass write attempt, likely successful on first pass.
    if (len <= 0)
        return;

    const int write_off = Buf.Size;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int double_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > double_capacity ? needed_sz : double_capacity);
    }

    Buf.resize(needed_sz);
    ImFormatStringV(&Buf[write_off] - 1, len+1, fmt, args_copy);
}